

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t encoder_destroy(aom_codec_alg_priv_t_conflict *ctx)

{
  QUANTS *pQVar1;
  long in_RDI;
  int i_1;
  int i;
  AV1_PRIMARY *ppi;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  AV1_COMP *in_stack_fffffffffffffff0;
  
  free(*(void **)(in_RDI + 0xb58));
  destroy_extra_config((av1_extracfg *)0x1d90db);
  if (*(long *)(in_RDI + 0xb50) != 0) {
    in_stack_fffffffffffffff0 = *(AV1_COMP **)(in_RDI + 0xb50);
    for (in_stack_ffffffffffffffec = 0; in_stack_ffffffffffffffec < 3;
        in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1) {
      if (*(long *)((long)(in_stack_fffffffffffffff0->enc_quant_dequant_params).quants.y_quant +
                   (long)in_stack_ffffffffffffffec * 0x48 + 0x10) != 0) {
        free(*(void **)((long)(in_stack_fffffffffffffff0->enc_quant_dequant_params).quants.y_quant +
                       (long)in_stack_ffffffffffffffec * 0x48 + 0x10));
      }
    }
    for (in_stack_ffffffffffffffe8 = 0; in_stack_ffffffffffffffe8 < 4;
        in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1) {
      av1_destroy_context_and_bufferpool
                (in_stack_fffffffffffffff0,
                 (BufferPool **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
    pQVar1 = &(in_stack_fffffffffffffff0->enc_quant_dequant_params).quants;
    *(int16_t *)((long)(pQVar1->y_quant + 0x15) + 0) = 0;
    *(int16_t *)((long)(pQVar1->y_quant + 0x15) + 2) = 0;
    *(int16_t *)((long)(pQVar1->y_quant + 0x15) + 4) = 0;
    *(int16_t *)((long)(pQVar1->y_quant + 0x15) + 6) = 0;
    if (*(long *)((in_stack_fffffffffffffff0->enc_quant_dequant_params).quants.y_quant[0x15] + 4) !=
        0) {
      av1_destroy_context_and_bufferpool
                (in_stack_fffffffffffffff0,
                 (BufferPool **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
    av1_remove_primary_compressor(_i_1);
  }
  destroy_stats_buffer
            ((STATS_BUFFER_CTX *)in_stack_fffffffffffffff0,
             (FIRSTPASS_STATS *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  aom_free(in_stack_fffffffffffffff0);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t encoder_destroy(aom_codec_alg_priv_t *ctx) {
  free(ctx->cx_data);
  destroy_extra_config(&ctx->extra_cfg);

  if (ctx->ppi) {
    AV1_PRIMARY *ppi = ctx->ppi;
    for (int i = 0; i < MAX_PARALLEL_FRAMES - 1; i++) {
      if (ppi->parallel_frames_data[i].cx_data) {
        free(ppi->parallel_frames_data[i].cx_data);
      }
    }
#if CONFIG_ENTROPY_STATS
    print_entropy_stats(ppi);
#endif
#if CONFIG_INTERNAL_STATS
    print_internal_stats(ppi);
#endif

    for (int i = 0; i < MAX_PARALLEL_FRAMES; i++) {
      av1_destroy_context_and_bufferpool(ppi->parallel_cpi[i],
                                         &ctx->buffer_pool);
    }
    ppi->cpi = NULL;

    if (ppi->cpi_lap) {
      av1_destroy_context_and_bufferpool(ppi->cpi_lap, &ctx->buffer_pool_lap);
    }
    av1_remove_primary_compressor(ppi);
  }
  destroy_stats_buffer(&ctx->stats_buf_context, ctx->frame_stats_buffer);
  aom_free(ctx);
  return AOM_CODEC_OK;
}